

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O0

bool __thiscall sf::priv::GlContext::setActive(GlContext *this,bool active)

{
  uint uVar1;
  GlContext *pGVar2;
  byte in_SIL;
  GlContext *in_RDI;
  Lock lock_1;
  Lock lock;
  undefined6 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  Mutex *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  bool local_1;
  
  if ((in_SIL & 1) == 0) {
    pGVar2 = ThreadLocalPtr::operator_cast_to_GlContext_
                       ((ThreadLocalPtr<sf::priv::GlContext> *)0x23ad69);
    if (in_RDI == pGVar2) {
      Lock::Lock((Lock *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
      uVar1 = (*in_RDI->_vptr_GlContext[4])(in_RDI,0);
      local_1 = (uVar1 & 1) != 0;
      if (local_1) {
        ThreadLocalPtr<sf::priv::GlContext>::operator=
                  ((ThreadLocalPtr<sf::priv::GlContext> *)in_RDI,
                   (GlContext *)
                   CONCAT17(in_stack_ffffffffffffffbf,
                            CONCAT16((char)uVar1,in_stack_ffffffffffffffb8)));
      }
      Lock::~Lock((Lock *)in_RDI);
    }
    else {
      local_1 = true;
    }
  }
  else {
    pGVar2 = ThreadLocalPtr::operator_cast_to_GlContext_
                       ((ThreadLocalPtr<sf::priv::GlContext> *)0x23acb3);
    if (in_RDI == pGVar2) {
      local_1 = true;
    }
    else {
      Lock::Lock((Lock *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
      uVar1 = (*in_RDI->_vptr_GlContext[4])(in_RDI,1);
      local_1 = (uVar1 & 1) != 0;
      if (local_1) {
        ThreadLocalPtr<sf::priv::GlContext>::operator=
                  ((ThreadLocalPtr<sf::priv::GlContext> *)in_RDI,
                   (GlContext *)
                   CONCAT17((char)uVar1,
                            CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8)));
      }
      Lock::~Lock((Lock *)in_RDI);
    }
  }
  return local_1;
}

Assistant:

bool GlContext::setActive(bool active)
{
    using GlContextImpl::mutex;
    using GlContextImpl::currentContext;
    using GlContextImpl::sharedContext;

    if (active)
    {
        if (this != currentContext)
        {
            Lock lock(mutex);

            // Activate the context
            if (makeCurrent(true))
            {
                // Set it as the new current context for this thread
                currentContext = this;
                return true;
            }
            else
            {
                return false;
            }
        }
        else
        {
            // This context is already the active one on this thread, don't do anything
            return true;
        }
    }
    else
    {
        if (this == currentContext)
        {
            Lock lock(mutex);

            // Deactivate the context
            if (makeCurrent(false))
            {
                currentContext = NULL;
                return true;
            }
            else
            {
                return false;
            }
        }
        else
        {
            // This context is not the active one on this thread, don't do anything
            return true;
        }
    }
}